

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

_Bool chck_buffer_resize(chck_buffer *buf,size_t size)

{
  uint8_t *puVar1;
  long lVar2;
  _Bool _Var3;
  
  if (buf != (chck_buffer *)0x0) {
    _Var3 = true;
    if (buf->size != size) {
      if (size == 0) {
        chck_buffer_flush(buf);
      }
      else {
        if (buf->copied == true) {
          puVar1 = buf->buffer;
        }
        else {
          puVar1 = (uint8_t *)0x0;
        }
        puVar1 = (uint8_t *)realloc(puVar1,size);
        if (puVar1 == (uint8_t *)0x0) {
          _Var3 = false;
        }
        else {
          lVar2 = (long)buf->curpos - (long)buf->buffer;
          if ((long)size < lVar2) {
            lVar2 = buf->size - size;
          }
          buf->curpos = puVar1 + lVar2;
          buf->size = size;
          buf->buffer = puVar1;
          buf->copied = true;
        }
      }
    }
    return _Var3;
  }
  __assert_fail("buf",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                ,0x94,"_Bool chck_buffer_resize(struct chck_buffer *, size_t)");
}

Assistant:

bool
chck_buffer_resize(struct chck_buffer *buf, size_t size)
{
   assert(buf);

   if (unlikely(size == buf->size))
      return true;

   if (unlikely(size == 0)) {
      chck_buffer_flush(buf);
      return true;
   }

   uint8_t *tmp;
   if (!(tmp = realloc((buf->copied ? buf->buffer : NULL), size)))
      return false;

   /* set new buffer position */
   if (buf->curpos - buf->buffer > (ptrdiff_t)size) {
      buf->curpos = tmp + (buf->size - size);
   } else {
      buf->curpos = tmp + (buf->curpos - buf->buffer);
   }

   buf->size = size;
   buf->buffer = tmp;
   buf->copied = true;
   return true;
}